

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O2

Builder * arangodb::velocypack::Collection::keep
                    (Builder *__return_storage_ptr__,Slice slice,
                    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *keys)

{
  _Alloc_hider _Var1;
  const_iterator cVar2;
  string_view attrName;
  uint8_t *local_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_78;
  ObjectIterator it;
  string key;
  string *psVar3;
  
  local_78 = &keys->_M_h;
  Builder::Builder(__return_storage_ptr__);
  Value::Value((Value *)&it,Object,false);
  Builder::addInternal<arangodb::velocypack::Value>(__return_storage_ptr__,(Value *)&it);
  ObjectIterator::ObjectIterator(&it,slice,false);
  while (it._position != it._size) {
    local_80 = (uint8_t *)ObjectIterator::key(&it,true);
    SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::copyString_abi_cxx11_
              (&key,(SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&local_80)
    ;
    slice._start = (uint8_t *)&key;
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(local_78,&key);
    psVar3 = (string *)key._M_string_length;
    _Var1 = key._M_dataplus;
    if (cVar2.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_80 = (uint8_t *)ObjectIterator::value(&it);
      attrName._M_str = _Var1._M_p;
      attrName._M_len = (size_t)psVar3;
      Builder::addInternal<arangodb::velocypack::Slice>
                (__return_storage_ptr__,attrName,(Slice *)&local_80);
      slice._start = (uint8_t *)psVar3;
    }
    ObjectIterator::next(&it);
    std::__cxx11::string::~string((string *)&key);
  }
  Builder::close(__return_storage_ptr__,(int)slice._start);
  return __return_storage_ptr__;
}

Assistant:

Builder Collection::keep(Slice slice,
                         std::unordered_set<std::string> const& keys) {
  Builder b;
  b.add(Value(ValueType::Object));

  ObjectIterator it(slice, /*useSequentialIteration*/ false);

  while (it.valid()) {
    auto key = it.key(true).copyString();
    if (keys.find(key) != keys.end()) {
      b.add(key, it.value());
    }
    it.next();
  }

  b.close();
  return b;
}